

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O0

void __thiscall OpenMD::Snapshot::wrapVector(Snapshot *this,Vector3d *pos)

{
  double *pdVar1;
  Vector<double,_3U> *in_RSI;
  long in_RDI;
  RealType RVar2;
  double dVar3;
  int i_1;
  RealType scaled_1;
  int i;
  Vector3d scaled;
  Vector<double,_3U> *in_stack_ffffffffffffff68;
  Vector<double,_3U> *in_stack_ffffffffffffff70;
  Vector3<double> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint i_00;
  RectMatrix<double,_3U,_3U> *in_stack_ffffffffffffff98;
  uint local_44;
  Vector<double,_3U> local_28;
  Vector<double,_3U> *local_10;
  
  if ((*(byte *)(in_RDI + 0x670) & 1) != 0) {
    if ((*(byte *)(in_RDI + 0x671) & 1) == 0) {
      OpenMD::operator*(in_stack_ffffffffffffff98,
                        (Vector<double,_3U> *)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      Vector3<double>::Vector3
                ((Vector3<double> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      for (local_44 = 0; (int)local_44 < 3; local_44 = local_44 + 1) {
        Vector<double,_3U>::operator[](&local_28,local_44);
        RVar2 = roundMe(in_stack_ffffffffffffff70->data_);
        pdVar1 = Vector<double,_3U>::operator[](&local_28,local_44);
        *pdVar1 = *pdVar1 - RVar2;
      }
      OpenMD::operator*(in_stack_ffffffffffffff98,
                        (Vector<double,_3U> *)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      Vector3<double>::operator=(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    }
    else {
      local_10 = in_RSI;
      for (i_00 = 0; (int)i_00 < 3; i_00 = i_00 + 1) {
        pdVar1 = Vector<double,_3U>::operator[](local_10,i_00);
        dVar3 = *pdVar1;
        pdVar1 = RectMatrix<double,_3U,_3U>::operator()
                           ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x598),i_00,i_00);
        dVar3 = dVar3 * *pdVar1;
        RVar2 = roundMe(in_stack_ffffffffffffff70->data_);
        in_stack_ffffffffffffff70 = (Vector<double,_3U> *)(dVar3 - RVar2);
        pdVar1 = RectMatrix<double,_3U,_3U>::operator()
                           ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x550),i_00,i_00);
        dVar3 = (double)in_stack_ffffffffffffff70 * *pdVar1;
        pdVar1 = Vector<double,_3U>::operator[](local_10,i_00);
        *pdVar1 = dVar3;
      }
    }
  }
  return;
}

Assistant:

void Snapshot::wrapVector(Vector3d& pos) {
    if (!frameData.usePBC) return;

    if (!frameData.orthoRhombic) {
      Vector3d scaled = frameData.invHmat * pos;
      for (int i = 0; i < 3; i++) {
        scaled[i] -= roundMe(scaled[i]);
      }
      // calc the wrapped real coordinates from the wrapped scaled coordinates
      pos = frameData.hmat * scaled;
    } else {
      RealType scaled;
      for (int i = 0; i < 3; i++) {
        scaled = pos[i] * frameData.invHmat(i, i);
        scaled -= roundMe(scaled);
        pos[i] = scaled * frameData.hmat(i, i);
      }
    }
  }